

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiWindowTempData::ImGuiWindowTempData(ImGuiWindowTempData *this)

{
  ImVec2 IVar1;
  ImVec1 local_50;
  ImVec1 local_4c;
  ImVec1 local_48;
  ImVec2 local_44;
  ImRect local_3c;
  ImVec2 local_2c;
  ImVec2 local_24 [2];
  ImGuiWindowTempData *local_10;
  ImGuiWindowTempData *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->CursorPos);
  ImVec2::ImVec2(&this->CursorPosPrevLine);
  ImVec2::ImVec2(&this->CursorStartPos);
  ImVec2::ImVec2(&this->CursorMaxPos);
  ImVec2::ImVec2(&this->CurrLineSize);
  ImVec2::ImVec2(&this->PrevLineSize);
  ImRect::ImRect(&this->LastItemRect);
  ImRect::ImRect(&this->LastItemDisplayRect);
  ImVec2::ImVec2(&this->MenuBarOffset);
  ImVector<ImGuiWindow_*>::ImVector(&this->ChildWindows);
  ImVector<int>::ImVector(&this->ItemFlagsStack);
  ImVector<float>::ImVector(&this->ItemWidthStack);
  ImVector<float>::ImVector(&this->TextWrapPosStack);
  ImVector<ImGuiGroupData>::ImVector(&this->GroupStack);
  ImVec1::ImVec1(&this->Indent);
  ImVec1::ImVec1(&this->GroupOffset);
  ImVec1::ImVec1(&this->ColumnsOffset);
  ImVec2::ImVec2(local_24,0.0,0.0);
  this->CursorMaxPos = local_24[0];
  this->CursorStartPos = this->CursorMaxPos;
  this->CursorPosPrevLine = this->CursorStartPos;
  this->CursorPos = this->CursorPosPrevLine;
  ImVec2::ImVec2(&local_2c,0.0,0.0);
  this->PrevLineSize = local_2c;
  this->CurrLineSize = this->PrevLineSize;
  this->PrevLineTextBaseOffset = 0.0;
  this->CurrLineTextBaseOffset = 0.0;
  this->TreeDepth = 0;
  this->TreeStoreMayJumpToParentOnPop = 0;
  this->LastItemId = 0;
  this->LastItemStatusFlags = 0;
  ImRect::ImRect(&local_3c);
  (this->LastItemDisplayRect).Min = local_3c.Min;
  (this->LastItemDisplayRect).Max = local_3c.Max;
  IVar1 = (this->LastItemDisplayRect).Max;
  (this->LastItemRect).Min = (this->LastItemDisplayRect).Min;
  (this->LastItemRect).Max = IVar1;
  this->NavLayerActiveMaskNext = 0;
  this->NavLayerActiveMask = 0;
  this->NavLayerCurrent = ImGuiNavLayer_Main;
  this->NavLayerCurrentMask = 1;
  this->NavHideHighlightOneFrame = false;
  this->NavHasScroll = false;
  this->MenuBarAppending = false;
  ImVec2::ImVec2(&local_44,0.0,0.0);
  this->MenuBarOffset = local_44;
  this->StateStorage = (ImGuiStorage *)0x0;
  this->ParentLayoutType = 1;
  this->LayoutType = 1;
  this->FocusCounterTab = -1;
  this->FocusCounterAll = -1;
  this->ItemFlags = 0;
  this->ItemWidth = 0.0;
  this->TextWrapPos = -1.0;
  this->StackSizesBackup[4] = 0;
  this->StackSizesBackup[5] = 0;
  this->StackSizesBackup[0] = 0;
  this->StackSizesBackup[1] = 0;
  this->StackSizesBackup[2] = 0;
  this->StackSizesBackup[3] = 0;
  ImVec1::ImVec1(&local_48,0.0);
  (this->Indent).x = local_48.x;
  ImVec1::ImVec1(&local_4c,0.0);
  (this->GroupOffset).x = local_4c.x;
  ImVec1::ImVec1(&local_50,0.0);
  (this->ColumnsOffset).x = local_50.x;
  this->CurrentColumns = (ImGuiColumns *)0x0;
  return;
}

Assistant:

ImGuiWindowTempData()
    {
        CursorPos = CursorPosPrevLine = CursorStartPos = CursorMaxPos = ImVec2(0.0f, 0.0f);
        CurrLineSize = PrevLineSize = ImVec2(0.0f, 0.0f);
        CurrLineTextBaseOffset = PrevLineTextBaseOffset = 0.0f;
        TreeDepth = 0;
        TreeStoreMayJumpToParentOnPop = 0x00;
        LastItemId = 0;
        LastItemStatusFlags = 0;
        LastItemRect = LastItemDisplayRect = ImRect();
        NavLayerActiveMask = NavLayerActiveMaskNext = 0x00;
        NavLayerCurrent = ImGuiNavLayer_Main;
        NavLayerCurrentMask = (1 << ImGuiNavLayer_Main);
        NavHideHighlightOneFrame = false;
        NavHasScroll = false;
        MenuBarAppending = false;
        MenuBarOffset = ImVec2(0.0f, 0.0f);
        StateStorage = NULL;
        LayoutType = ParentLayoutType = ImGuiLayoutType_Vertical;
        FocusCounterAll = FocusCounterTab = -1;

        ItemFlags = ImGuiItemFlags_Default_;
        ItemWidth = 0.0f;
        TextWrapPos = -1.0f;
        memset(StackSizesBackup, 0, sizeof(StackSizesBackup));

        Indent = ImVec1(0.0f);
        GroupOffset = ImVec1(0.0f);
        ColumnsOffset = ImVec1(0.0f);
        CurrentColumns = NULL;
    }